

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O0

bool __thiscall
cmCMakeHostSystemInformationCommand::InitialPass
          (cmCMakeHostSystemInformationCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  SystemInformation *this_00;
  cmMakefile *this_01;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 *puVar4;
  string *psVar5;
  char *value_00;
  undefined1 local_f0 [8];
  string value;
  string *key;
  size_t i;
  string result_list;
  SystemInformation info;
  string local_90;
  const_reference local_70;
  string *variable;
  allocator local_51;
  string local_50;
  string *local_30;
  size_t current_index;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCMakeHostSystemInformationCommand *this_local;
  
  local_30 = (string *)0x0;
  current_index = (size_t)param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if ((long)local_30 + 2U <= sVar2) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,(size_type)local_30);
    bVar1 = std::operator!=(pvVar3,"RESULT");
    if (!bVar1) {
      local_70 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(long)local_30 + 1);
      local_30 = (string *)((long)local_30 + 2);
      puVar4 = (undefined1 *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local);
      if (&local_30->field_0x2 <= puVar4) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(size_type)local_30);
        bVar1 = std::operator!=(pvVar3,"QUERY");
        if (!bVar1) {
          this_00 = (SystemInformation *)((long)&result_list.field_2 + 8);
          cmsys::SystemInformation::SystemInformation(this_00);
          cmsys::SystemInformation::RunCPUCheck(this_00);
          cmsys::SystemInformation::RunOSCheck
                    ((SystemInformation *)((long)&result_list.field_2 + 8));
          cmsys::SystemInformation::RunMemoryCheck
                    ((SystemInformation *)((long)&result_list.field_2 + 8));
          std::__cxx11::string::string((string *)&i);
          key = local_30;
          do {
            key = (string *)&key->field_0x1;
            psVar5 = (string *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local);
            pvVar3 = local_70;
            if (psVar5 <= key) {
              this_01 = (this->super_cmCommand).Makefile;
              value_00 = (char *)std::__cxx11::string::c_str();
              cmMakefile::AddDefinition(this_01,pvVar3,value_00);
              this_local._7_1_ = 1;
              break;
            }
            value.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(size_type)key);
            if (key != (string *)&local_30->field_0x1) {
              std::__cxx11::string::operator+=((string *)&i,";");
            }
            std::__cxx11::string::string((string *)local_f0);
            bVar1 = GetValue(this,(SystemInformation *)((long)&result_list.field_2 + 8),
                             (string *)value.field_2._8_8_,(string *)local_f0);
            if (bVar1) {
              std::__cxx11::string::operator+=((string *)&i,(string *)local_f0);
            }
            else {
              this_local._7_1_ = 0;
            }
            std::__cxx11::string::~string((string *)local_f0);
          } while (bVar1);
          std::__cxx11::string::~string((string *)&i);
          cmsys::SystemInformation::~SystemInformation
                    ((SystemInformation *)((long)&result_list.field_2 + 8));
          goto LAB_006876a2;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_90,"missing QUERY specification",
                 (allocator *)((long)&info.Implementation + 7));
      cmCommand::SetError(&this->super_cmCommand,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)((long)&info.Implementation + 7));
      this_local._7_1_ = 0;
      goto LAB_006876a2;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"missing RESULT specification.",&local_51);
  cmCommand::SetError(&this->super_cmCommand,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  this_local._7_1_ = 0;
LAB_006876a2:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCMakeHostSystemInformationCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  size_t current_index = 0;

  if (args.size() < (current_index + 2) || args[current_index] != "RESULT") {
    this->SetError("missing RESULT specification.");
    return false;
  }

  std::string const& variable = args[current_index + 1];
  current_index += 2;

  if (args.size() < (current_index + 2) || args[current_index] != "QUERY") {
    this->SetError("missing QUERY specification");
    return false;
  }

  cmsys::SystemInformation info;
  info.RunCPUCheck();
  info.RunOSCheck();
  info.RunMemoryCheck();

  std::string result_list;
  for (size_t i = current_index + 1; i < args.size(); ++i) {
    std::string const& key = args[i];
    if (i != current_index + 1) {
      result_list += ";";
    }
    std::string value;
    if (!this->GetValue(info, key, value)) {
      return false;
    }
    result_list += value;
  }

  this->Makefile->AddDefinition(variable, result_list.c_str());

  return true;
}